

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

run_container_t * run_container_from_array(array_container_t *c)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint16_t *puVar4;
  rle16_t *prVar5;
  uint uVar6;
  uint uVar7;
  int32_t size;
  run_container_t *prVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  size = array_container_number_of_runs(c);
  prVar8 = run_container_create_given_capacity(size);
  uVar2 = c->cardinality;
  if ((ulong)uVar2 != 0) {
    if ((int)uVar2 < 1) {
      uVar9 = 0xfffffffe;
      uVar11 = 0xffffffff;
    }
    else {
      puVar4 = c->array;
      uVar11 = 0xffffffff;
      uVar9 = 0xfffffffe;
      uVar10 = 0;
      do {
        uVar1 = puVar4[uVar10];
        if (uVar9 + 1 == (uint)uVar1) {
          uVar6 = (uint)uVar1;
          uVar7 = uVar11;
        }
        else {
          uVar6 = (uint)uVar1;
          uVar7 = (uint)uVar1;
          if (uVar11 != 0xffffffff) {
            prVar5 = prVar8->runs;
            iVar3 = prVar8->n_runs;
            prVar5[iVar3].value = (uint16_t)uVar11;
            prVar5[iVar3].length = (short)uVar9 - (uint16_t)uVar11;
            prVar8->n_runs = iVar3 + 1;
            uVar6 = (uint)puVar4[uVar10];
          }
        }
        uVar11 = uVar7;
        uVar9 = uVar6;
        uVar10 = uVar10 + 1;
      } while (uVar2 != uVar10);
    }
    prVar5 = prVar8->runs;
    iVar3 = prVar8->n_runs;
    prVar5[iVar3].value = (uint16_t)uVar11;
    prVar5[iVar3].length = (short)uVar9 - (uint16_t)uVar11;
    prVar8->n_runs = iVar3 + 1;
  }
  return prVar8;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}